

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_resources.cpp
# Opt level: O2

bool dxil_spv::emit_load_input_instruction(Impl *impl,CallInst *instruction)

{
  CallInst *pCVar1;
  bool bVar2;
  bool bVar3;
  Id IVar4;
  Id IVar5;
  uint uVar6;
  Builder *pBVar7;
  iterator iVar8;
  Operation *pOVar9;
  size_type sVar10;
  Value *pVVar11;
  Constant *this;
  APInt *this_00;
  uint64_t uVar12;
  Op OVar13;
  mapped_type *pmVar14;
  uint32_t input_element_index;
  Id local_6c;
  CallInst *local_68;
  mapped_type *local_60;
  uint local_58;
  BuiltIn builtin_1;
  Value *local_50;
  BuiltIn builtin;
  undefined4 uStack_44;
  size_type local_40;
  Id local_38;
  Id local_34;
  
  pBVar7 = Converter::Impl::builder(impl);
  bVar2 = get_constant_operand(&instruction->super_Instruction,1,&input_element_index);
  if (!bVar2) {
    return bVar2;
  }
  _builtin = (Id *)CONCAT44(uStack_44,input_element_index);
  iVar8 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ClipCullMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ClipCullMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(impl->input_clip_cull_meta)._M_h,&builtin);
  if (iVar8.
      super__Node_iterator_base<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ClipCullMeta>,_false>
      ._M_cur != (__node_type *)0x0) {
    IVar4 = get_clip_cull_distance_access_chain
                      (impl,instruction,
                       (ClipCullMeta *)
                       ((long)iVar8.
                              super__Node_iterator_base<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ClipCullMeta>,_false>
                              ._M_cur + 0xc),StorageClassInput);
    pOVar9 = Converter::Impl::allocate(impl,OpLoad,(Value *)instruction);
    Operation::add_id(pOVar9,IVar4);
    Converter::Impl::add(impl,pOVar9,false);
    return bVar2;
  }
  local_68 = instruction;
  local_60 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&impl->input_elements_meta,&input_element_index);
  IVar4 = local_60->id;
  IVar5 = spv::Builder::getDerefTypeId(pBVar7,IVar4);
  if ((impl->execution_model - ExecutionModelTessellationControl < 3) ||
     (sVar10 = std::
               _Hashtable<unsigned_int,_unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::count(&(impl->llvm_attribute_at_vertex_indices)._M_h,&input_element_index),
     sVar10 != 0)) {
    IVar5 = spv::Builder::getContainedTypeId(pBVar7,IVar5);
    bVar3 = true;
  }
  else {
    bVar3 = false;
  }
  OVar13 = (pBVar7->module).idToInstruction.
           super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
           ._M_impl.super__Vector_impl_data._M_start[IVar5]->opCode & ~OpUndef;
  if (OVar13 == OpTypeArray) {
    IVar5 = spv::Builder::getContainedTypeId(pBVar7,IVar5);
  }
  uVar6 = spv::Builder::getNumTypeConstituents(pBVar7,IVar5);
  local_6c = IVar4;
  if ((bool)(1 < uVar6 | bVar3 | OVar13 == OpTypeArray)) {
    local_58 = uVar6;
    IVar5 = Converter::Impl::get_effective_input_output_type_id(impl,local_60->component_type);
    IVar5 = spv::Builder::makePointer(pBVar7,StorageClassInput,IVar5);
    pOVar9 = Converter::Impl::allocate(impl,OpAccessChain,IVar5);
    local_6c = pOVar9->id;
    Operation::add_id(pOVar9,IVar4);
    pCVar1 = local_68;
    if (bVar3) {
      local_50 = LLVMBC::Instruction::getOperand(&local_68->super_Instruction,4);
      bVar3 = LLVMBC::isa<LLVMBC::UndefValue>(local_50);
      if (bVar3) {
        IVar5 = spv::Builder::makeUintConstant(pBVar7,0,false);
      }
      else {
        IVar5 = Converter::Impl::get_id_for_value(impl,local_50,0);
      }
      Operation::add_id(pOVar9,IVar5);
    }
    if (OVar13 == OpTypeArray) {
      pVVar11 = LLVMBC::Instruction::getOperand(&pCVar1->super_Instruction,2);
      IVar5 = Converter::Impl::get_id_for_value(impl,pVVar11,0);
      Operation::add_id(pOVar9,IVar5);
    }
    if (1 < local_58) {
      pVVar11 = LLVMBC::Instruction::getOperand(&pCVar1->super_Instruction,3);
      IVar5 = Converter::Impl::get_id_for_value(impl,pVVar11,0x20);
      Operation::add_id(pOVar9,IVar5);
    }
    Converter::Impl::add(impl,pOVar9,false);
  }
  pmVar14 = local_60;
  bVar3 = SPIRVModule::query_builtin_shader_input(impl->spirv_module,local_60->id,&builtin);
  if ((bVar3) && (builtin == BuiltInFrontFacing)) {
    pBVar7 = Converter::Impl::builder(impl);
    IVar5 = spv::Builder::makeBoolType(pBVar7);
  }
  else {
    IVar5 = Converter::Impl::get_effective_input_output_type_id(impl,pmVar14->component_type);
  }
  pCVar1 = local_68;
  pOVar9 = Converter::Impl::allocate(impl,OpLoad,(Value *)local_68,IVar5);
  Operation::add_id(pOVar9,local_6c);
  Converter::Impl::add(impl,pOVar9,false);
  pBVar7 = Converter::Impl::builder(impl);
  bVar3 = SPIRVModule::query_builtin_shader_input(impl->spirv_module,IVar4,&builtin_1);
  if (bVar3) {
    if ((builtin_1 & ~BuiltInPointSize) == BuiltInVertexIndex) {
      IVar4 = SPIRVModule::get_builtin_shader_input
                        (impl->spirv_module,builtin_1 == BuiltInInstanceIndex | BuiltInBaseVertex);
      IVar5 = spv::Builder::makeUintType(pBVar7,0x20);
      pOVar9 = Converter::Impl::allocate(impl,OpLoad,IVar5);
      Operation::add_id(pOVar9,IVar4);
      pmVar14 = local_60;
      IVar4 = pOVar9->id;
      Converter::Impl::add(impl,pOVar9,false);
      IVar5 = spv::Builder::makeUintType(pBVar7,0x20);
      pOVar9 = Converter::Impl::allocate(impl,OpISub,IVar5);
      local_38 = Converter::Impl::get_id_for_value(impl,(Value *)pCVar1,0);
      _builtin = &local_38;
      local_40 = 2;
      local_34 = IVar4;
      Operation::add_ids(pOVar9,(initializer_list<unsigned_int> *)&builtin);
      Converter::Impl::add(impl,pOVar9,false);
      Converter::Impl::rewrite_value(impl,(Value *)pCVar1,pOVar9->id);
      spv::Builder::addCapability(pBVar7,CapabilityDrawParameters);
    }
    else {
      if (builtin_1 == BuiltInFragCoord) {
        pVVar11 = LLVMBC::Instruction::getOperand(&pCVar1->super_Instruction,3);
        this = &LLVMBC::cast<LLVMBC::ConstantInt>(pVVar11)->super_Constant;
        this_00 = LLVMBC::Constant::getUniqueInteger(this);
        uVar12 = LLVMBC::APInt::getZExtValue(this_00);
        if (uVar12 != 3) goto LAB_00151a9a;
        IVar4 = spv::Builder::makeFloatType(pBVar7,0x20);
        pOVar9 = Converter::Impl::allocate(impl,OpFDiv,IVar4);
        IVar4 = spv::Builder::makeFloatConstant(pBVar7,1.0,false);
        Operation::add_id(pOVar9,IVar4);
        IVar4 = Converter::Impl::get_id_for_value(impl,(Value *)pCVar1,0);
      }
      else {
        if (builtin_1 != BuiltInFrontFacing) goto LAB_00151a9a;
        IVar4 = spv::Builder::makeUintType(pBVar7,0x20);
        pOVar9 = Converter::Impl::allocate(impl,OpSelect,IVar4);
        IVar4 = Converter::Impl::get_id_for_value(impl,(Value *)pCVar1,0);
        Operation::add_id(pOVar9,IVar4);
        IVar4 = spv::Builder::makeUintConstant(pBVar7,0xffffffff,false);
        Operation::add_id(pOVar9,IVar4);
        IVar4 = spv::Builder::makeUintConstant(pBVar7,0,false);
      }
      Operation::add_id(pOVar9,IVar4);
      Converter::Impl::add(impl,pOVar9,false);
      Converter::Impl::rewrite_value(impl,(Value *)pCVar1,pOVar9->id);
    }
  }
LAB_00151a9a:
  Converter::Impl::fixup_load_type_io(impl,pmVar14->component_type,1,(Value *)pCVar1);
  return bVar2;
}

Assistant:

bool emit_load_input_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();
	uint32_t input_element_index;
	if (!get_constant_operand(instruction, 1, &input_element_index))
		return false;

	// Need special handling for clip distance.
	auto *clip_cull_meta = input_clip_cull_distance_meta(impl, input_element_index);
	if (clip_cull_meta)
		return emit_load_clip_cull_distance(impl, instruction, *clip_cull_meta);

	const auto &meta = impl.input_elements_meta[input_element_index];
	uint32_t var_id = meta.id;
	uint32_t ptr_id;

	spv::Id input_type_id = builder.getDerefTypeId(var_id);

	bool array_index = false;
	if (impl.execution_model == spv::ExecutionModelTessellationControl ||
	    impl.execution_model == spv::ExecutionModelGeometry ||
	    impl.execution_model == spv::ExecutionModelTessellationEvaluation ||
	    impl.llvm_attribute_at_vertex_indices.count(input_element_index) != 0)
	{
		input_type_id = builder.getContainedTypeId(input_type_id);
		array_index = true;
	}

	bool row_index = false;
	if (builder.isArrayType(input_type_id))
	{
		row_index = true;
		input_type_id = builder.getContainedTypeId(input_type_id);
	}

	uint32_t num_cols = builder.getNumTypeComponents(input_type_id);

	if (num_cols > 1 || row_index || array_index)
	{
		// Need to deal with signed vs unsigned here.
		Operation *op =
			impl.allocate(spv::OpAccessChain,
			              builder.makePointer(spv::StorageClassInput,
			                                  impl.get_effective_input_output_type_id(meta.component_type)));
		ptr_id = op->id;

		op->add_id(var_id);
		// Vertex array index for GS/DS/HS or barycentrics.
		if (array_index)
		{
			auto *index = instruction->getOperand(4);
			if (llvm::isa<llvm::UndefValue>(index))
			{
				// If we loadInput on a barycentric input, we get nointerpolation,
				// i.e. flat, i.e. provoking vertex, i.e. vertex 0.
				op->add_id(builder.makeUintConstant(0));
			}
			else
				op->add_id(impl.get_id_for_value(index));
		}
		if (row_index)
			op->add_id(impl.get_id_for_value(instruction->getOperand(2)));
		if (num_cols > 1)
			op->add_id(impl.get_id_for_value(instruction->getOperand(3), 32));

		impl.add(op);
	}
	else
		ptr_id = var_id;

	// Need to deal with signed vs unsigned here.
	spv::Id load_type = get_builtin_load_type(impl, meta);

	Operation *op = impl.allocate(spv::OpLoad, instruction, load_type);
	op->add_id(ptr_id);
	impl.add(op);

	fixup_builtin_load(impl, var_id, instruction);

	// Need to bitcast after we load.
	impl.fixup_load_type_io(meta.component_type, 1, instruction);
	return true;
}